

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void NOSHFT(int NN,int L1,double *SR,double *SI,double *PR,double *PI,double *QPR,double *QPI,
           double *PVR,double *PVI,double ARE,double MRE,double ETA,double INFIN,double *HR,
           double *HI,double *QHR,double *QHI,double *SHR,double *SHI,double *TR,double *TI)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_98;
  double pit;
  double prt;
  int local_80;
  int j1;
  int jj;
  int j;
  int i1;
  int i;
  int NM1;
  int N;
  double T2;
  double T1;
  double XNI;
  double INFIN_local;
  double ETA_local;
  double MRE_local;
  double ARE_local;
  double *PI_local;
  double *PR_local;
  double *SI_local;
  double *SR_local;
  int L1_local;
  int NN_local;
  
  i = NN + -1;
  i1 = NN + -2;
  for (j = 1; j <= i; j = j + 1) {
    jj = j + -1;
    T1 = (double)(NN - j);
    HR[jj] = (T1 * PR[jj]) / (double)i;
    HI[jj] = (T1 * PI[jj]) / (double)i;
  }
  XNI = INFIN;
  INFIN_local = ETA;
  ETA_local = MRE;
  MRE_local = ARE;
  ARE_local = (double)PI;
  PI_local = PR;
  PR_local = SI;
  SI_local = SR;
  SR_local._0_4_ = L1;
  SR_local._4_4_ = NN;
  for (local_80 = 0; local_80 < (int)SR_local; local_80 = local_80 + 1) {
    dVar2 = CMOD(HR + (i + -1),HI + (i + -1));
    dVar3 = INFIN_local * 10.0;
    dVar4 = CMOD(PI_local + (i + -1),(double *)((long)ARE_local + (long)(i + -1) * 8));
    if (dVar2 <= dVar3 * dVar4) {
      for (j = 1; j <= i1; j = j + 1) {
        iVar1 = SR_local._4_4_ - j;
        j1 = iVar1 + -1;
        HR[j1] = HR[iVar1 + -2];
        HI[j1] = HI[iVar1 + -2];
      }
      *HR = 0.0;
      *HI = 0.0;
    }
    else {
      pit = *PI_local * -1.0;
      local_98 = *(double *)ARE_local * -1.0;
      CDIVID(&pit,&local_98,HR + (i + -1),HI + (i + -1),XNI,TR,TI);
      for (j = 1; j <= i1; j = j + 1) {
        j1 = (SR_local._4_4_ - j) + -1;
        prt._4_4_ = (SR_local._4_4_ - j) + -2;
        T2 = HR[prt._4_4_];
        _NM1 = HI[prt._4_4_];
        HR[j1] = *TR * T2 + -(*TI * _NM1) + PI_local[j1];
        HI[j1] = *TR * _NM1 + *TI * T2 + *(double *)((long)ARE_local + (long)j1 * 8);
      }
      *HR = *PI_local;
      *HI = *(double *)ARE_local;
    }
  }
  return;
}

Assistant:

static void NOSHFT(int NN,int L1, double *SR, double *SI, double *PR, double *PI, double *QPR, double *QPI, double *PVR, double *PVI,
	double ARE, double MRE, double ETA, double INFIN, double *HR, double *HI, double *QHR, double *QHI, double *SHR, double *SHI, double *TR, double *TI) {
	/*
	C COMPUTES  THE DERIVATIVE  POLYNOMIAL AS THE INITIAL H
	C POLYNOMIAL AND COMPUTES L1 NO-SHIFT H POLYNOMIALS.
	*/
	double XNI, T1, T2;
	int N, NM1, i, i1,j, jj,j1;
	double prt, pit;

	N = NN - 1;
	NM1 = N - 1;

	for (i = 1; i <= N; ++i) {
		i1 = i - 1;
		XNI = (double)(NN - i);
		HR[i1] = XNI*PR[i1] / (double)N;
		HI[i1] = XNI*PI[i1] / (double)N;
	}

	for (jj = 0; jj < L1; ++jj) {
		if (CMOD(&HR[N-1], &HI[N-1]) > ETA*10.0*CMOD(&PR[N-1], &PI[N-1])) {
			prt = -1.0 * *PR;
			pit = -1.0 * *PI;
			CDIVID(&prt, &pit, &HR[N - 1], &HI[N - 1], INFIN, TR, TI);
			for (i = 1; i <= NM1; ++i) {
				j = NN - i - 1;
				j1 = j - 1;
				T1 = HR[j1];
				T2 = HI[j1];
				HR[j] = *TR*T1 - *TI*T2 + PR[j];
				HI[j] = *TR*T2 + *TI*T1 + PI[j];
			}
			HR[0] = PR[0];
			HI[0] = PI[0];
		}
		else {
			for (i = 1; i <= NM1; ++i) {
				j = NN - i - 1;
				HR[j] = HR[j - 1];
				HI[j] = HI[j - 1];
			}
			HR[0] = 0.0;
			HI[0] = 0.0;
		}
	}

}